

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_selist.c
# Opt level: O3

void test_find_cb(CuTest *tc)

{
  _Bool _Var1;
  int a;
  int i;
  int c;
  int b;
  selist *il;
  selist *ql;
  undefined4 local_50;
  int local_4c [3];
  selist *local_40;
  selist *local_38;
  
  local_50 = 0x2a;
  local_4c[2] = 0x17;
  local_4c[1] = 0x2a;
  local_38 = (selist *)0x0;
  selist_push(&local_38,&local_50);
  selist_push(&local_38,local_4c + 2);
  selist_push(&local_38,local_4c + 1);
  local_40 = local_38;
  local_4c[0] = 0;
  _Var1 = selist_find(&local_40,local_4c,&local_50,cb_match_int);
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c"
                ,0x4c,"assert failed",(uint)_Var1);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c",
             0x4d,(char *)0x0,0,local_4c[0]);
  selist_advance(&local_40,local_4c,1);
  _Var1 = selist_find(&local_40,local_4c,&local_50,cb_match_int);
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c"
                ,0x50,"assert failed",(uint)_Var1);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c",
             0x51,(char *)0x0,2,local_4c[0]);
  selist_advance(&local_40,local_4c,1);
  _Var1 = selist_find(&local_40,local_4c,&local_50,cb_match_int);
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c"
                ,0x54,"assert failed",(uint)!_Var1);
  selist_free(local_38);
  return;
}

Assistant:

static void test_find_cb(CuTest *tc) {
    int a = 42;
    int b = 23;
    int c = 42;
    struct selist *ql = NULL;
    struct selist *il;
    int i;

    selist_push(&ql, (void *)&a);
    selist_push(&ql, (void *)&b);
    selist_push(&ql, (void *)&c);

    il = ql; i = 0;
    CuAssertTrue(tc, selist_find(&il, &i, (void *)&a, cb_match_int));
    CuAssertIntEquals(tc, 0, i);

    selist_advance(&il, &i, 1);
    CuAssertTrue(tc, selist_find(&il, &i, (void *)&a, cb_match_int));
    CuAssertIntEquals(tc, 2, i);

    selist_advance(&il, &i, 1);
    CuAssertTrue(tc, !selist_find(&il, &i, (void *)&a, cb_match_int));
    selist_free(ql);
}